

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_bind_parameter_index(sqlite3_stmt *pStmt,char *zName)

{
  int iVar1;
  
  iVar1 = sqlite3Strlen30(zName);
  iVar1 = sqlite3VdbeParameterIndex((Vdbe *)pStmt,zName,iVar1);
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_bind_parameter_index(sqlite3_stmt *pStmt, const char *zName){
  return sqlite3VdbeParameterIndex((Vdbe*)pStmt, zName, sqlite3Strlen30(zName));
}